

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O1

void lws_context_deprecate(lws_context *cx,lws_reload_func cb)

{
  byte *pbVar1;
  lws_vhost *plVar2;
  lws_dll2 *plVar3;
  lws_dll2 *plVar4;
  
  for (plVar2 = cx->vhost_list; plVar2 != (lws_vhost *)0x0; plVar2 = plVar2->vhost_next) {
    plVar4 = (plVar2->listen_wsi).head;
    while (plVar4 != (lws_dll2 *)0x0) {
      plVar3 = plVar4->next;
      pbVar1 = (byte *)((long)&plVar4[0x14].next + 7);
      *pbVar1 = *pbVar1 | 0x10;
      lws_close_free_wsi((lws *)&plVar4[-0x1b].next,LWS_CLOSE_STATUS_NOSTATUS,
                         "lws_context_deprecate");
      cx->deprecation_pending_listen_close_count = cx->deprecation_pending_listen_close_count + 1;
      plVar4 = plVar3;
    }
  }
  cx->field_0x7b7 = cx->field_0x7b7 | 1;
  cx->deprecation_cb = cb;
  return;
}

Assistant:

void
lws_context_deprecate(struct lws_context *cx, lws_reload_func cb)
{
	struct lws_vhost *vh = cx->vhost_list;

	/*
	 * "deprecation" means disable the cx from accepting any new
	 * connections and free up listen sockets to be used by a replacement
	 * cx.
	 *
	 * Otherwise the deprecated cx remains operational, until its
	 * number of connected sockets falls to zero, when it is deleted.
	 *
	 * So, for each vhost, close his listen sockets
	 */

	while (vh) {

		lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
					   lws_dll2_get_head(&vh->listen_wsi)) {
			struct lws *wsi = lws_container_of(d, struct lws,
							   listen_list);

			wsi->socket_is_permanently_unusable = 1;
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					   __func__);
			cx->deprecation_pending_listen_close_count++;

		} lws_end_foreach_dll_safe(d, d1);

		vh = vh->vhost_next;
	}

	cx->deprecated = 1;
	cx->deprecation_cb = cb;
}